

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int attr_list_subset(attr_list l1,attr_list l2)

{
  int iVar1;
  int iVar2;
  int found;
  attr l2_tmp;
  attr l1_tmp;
  int l2_count;
  int l1_count;
  int keep_going;
  int j;
  int i;
  undefined2 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9b;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  attr_p in_stack_ffffffffffffffa0;
  attr_p in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  attr_list in_stack_ffffffffffffffb8;
  int local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  local_24 = 1;
  iVar1 = attr_count((attr_list)
                     CONCAT44(in_stack_ffffffffffffff9c,
                              CONCAT13(in_stack_ffffffffffffff9b,
                                       CONCAT12(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)
                                      )));
  iVar2 = attr_count((attr_list)
                     CONCAT44(in_stack_ffffffffffffff9c,
                              CONCAT13(in_stack_ffffffffffffff9b,
                                       CONCAT12(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)
                                      )));
  if (iVar2 < iVar1) {
    local_4 = 0;
  }
  else {
    for (local_1c = 0; uVar3 = local_1c < iVar1 && local_24 != 0, local_1c < iVar1 && local_24 != 0;
        local_1c = local_1c + 1) {
      local_24 = 0;
      get_pattr(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                &in_stack_ffffffffffffffa8->attr_id,(attr_value_type *)in_stack_ffffffffffffffa0,
                (attr_union *)
                (ulong)CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98))
               );
      for (local_20 = 0; in_stack_ffffffffffffff9a = local_24 == 0 && local_20 < iVar2,
          local_24 == 0 && local_20 < iVar2; local_20 = local_20 + 1) {
        get_pattr(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                  &in_stack_ffffffffffffffa8->attr_id,(attr_value_type *)in_stack_ffffffffffffffa0,
                  (attr_union *)
                  CONCAT44(local_24,CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffff9a,
                                                            in_stack_ffffffffffffff98))));
        local_24 = compare_attr_p_by_val(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      }
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

extern
int
attr_list_subset (attr_list l1, attr_list l2)
{
  /*
   *  This function returns true if l1 is a subset of l2.  I
   *  define this as:  for each element of l1, there is an element
   *  of l2 with the same attribute name, attribute type, and attribute
   *  value.
   */
  int i, j, keep_going = 1;
  int l1_count;
  int l2_count;
  attr l1_tmp, l2_tmp;

  l1_count = attr_count (l1);
  l2_count = attr_count (l2);
  
  if (l2_count < l1_count) return 0;

  for (i = 0; i < l1_count && keep_going; i++)
    {
      int found = 0;
      get_pattr (l1, i, &l1_tmp.attr_id, &l1_tmp.val_type, &l1_tmp.value);

      for (j = 0; !found && j < l2_count; j++)
	{
	    get_pattr (l2, j, &l2_tmp.attr_id, &l2_tmp.val_type,
		      &l2_tmp.value);
	  
	  found = compare_attr_p_by_val (&l1_tmp, &l2_tmp);
	}

      keep_going = found;
    }

  return keep_going;
}